

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

void prsdefobj(prscxdef *ctx,tokdef *tok,int typ)

{
  ushort *puVar1;
  ushort uVar2;
  lindef *plVar3;
  undefined8 in_RAX;
  uchar *puVar4;
  mcmon newobj;
  ushort local_22;
  
  local_22 = (ushort)((ulong)in_RAX >> 0x30);
  puVar4 = mcmalo0(ctx->prscxmem,0x100,&local_22,0xffff,0);
  puVar4[0] = '\0';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[8] = '\0';
  puVar4[9] = '\0';
  puVar4[10] = '\0';
  puVar4[0xb] = '\0';
  puVar4[0xc] = '\0';
  puVar4[0xd] = '\0';
  plVar3 = ctx->prscxtok->tokcxlin;
  (*plVar3->linppos)(plVar3,(char *)(puVar4 + 0xe),0xf2);
  uVar2 = ctx->prscxmem->mcmcxmtb[local_22 >> 8][local_22 & 0xff];
  puVar1 = (ushort *)
           ((long)&ctx->prscxmem->mcmcxgl->mcmcxtab[uVar2 >> 8]->mcmoflg +
           (ulong)((uVar2 & 0xff) << 5));
  *puVar1 = *puVar1 | 1;
  mcmunlck(ctx->prscxmem,local_22);
  (tok->toksym).toksval = local_22;
  return;
}

Assistant:

void prsdefobj(prscxdef *ctx, tokdef *tok, int typ)
{
    mcmon  newobj;
    uchar *p;

    /* allocate the object and clear its memory */
    p = mcmalo(ctx->prscxmem, (ushort)PRSOBJSIZ, &newobj);
    memset(p, 0, (size_t)OBJDEFSIZ);

    /* save the line position after the object header */
    linppos(ctx->prscxtok->tokcxlin, (char *)p + OBJDEFSIZ,
            (uint)(PRSOBJSIZ - OBJDEFSIZ));

#ifdef OS_ERRLINE
    /* save the source line for error displays later on */
    {
        int   len;
        int   need;

                    /* compute how much space we'll need for the line */
        len = ctx->prscxtok->tokcxlin->linlen + 1;
        need = len + OBJDEFSIZ
               + strlen((char *)p + OBJDEFSIZ) + 1;

                    /* reallocate the object if we need more room */
        if (need > PRSOBJSIZ)
            p = mcmrealo(ctx->prscxmem, newobj, need);

                    /* copy the line */
        p += OBJDEFSIZ;
        p += strlen((char *)p) + 1;
        memcpy(p, ctx->prscxtok->tokcxlin->linbuf, (size_t)len);
        p[len] = '\0';
    }
#endif

    /* unlock the object */
    mcmtch(ctx->prscxmem, newobj);
    mcmunlck(ctx->prscxmem, newobj);

    /* set the symbol to point to the new object */
    tok->toksym.toksval = newobj;
}